

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VGetCommunicator(N_Vector W,SUNComm comm,int myid)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  SUNComm wcomm;
  int local_4;
  
  iVar1 = N_VGetCommunicator(in_RDI);
  if ((iVar1 == 0) && (in_ESI == 0)) {
    printf("PASSED test -- N_VGetCommunicator\n");
    local_4 = 0;
  }
  else if (iVar1 == 0) {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly reports NULL comm)\n",
           (ulong)in_EDX);
    local_4 = 1;
  }
  else if (in_ESI == 0) {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly reports non-NULL comm)\n",
           (ulong)in_EDX);
    local_4 = 1;
  }
  else {
    if (in_EDX == 0) {
      printf(">>> FAILED test -- N_VGetCommunicator, Proc %d has non-NULL comm with MPI disabled\n",
             0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Test_N_VGetCommunicator(N_Vector W, SUNComm comm, int myid)
{
  SUNComm wcomm;

  /* ask W for its communicator */
  wcomm = N_VGetCommunicator(W);

  /* return with success if both are NULL */
  if ((wcomm == SUN_COMM_NULL) && (comm == SUN_COMM_NULL))
  {
    printf("PASSED test -- N_VGetCommunicator\n");
    return (0);
  }

  /* return with failure if either is NULL */
  if (wcomm == SUN_COMM_NULL)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly "
           "reports NULL comm)\n",
           myid);
    return (1);
  }
  if (comm == SUN_COMM_NULL)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d (incorrectly "
           "reports non-NULL comm)\n",
           myid);
    return (1);
  }

  if (myid == 0)
  {
    printf(">>> FAILED test -- N_VGetCommunicator, Proc %d has non-NULL comm "
           "with MPI disabled\n",
           myid);
  }

  return (0);
}